

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int is_almost_static(double gf_zero_motion,int kf_zero_motion,int is_lap_enabled)

{
  bool local_19;
  int is_lap_enabled_local;
  int kf_zero_motion_local;
  double gf_zero_motion_local;
  uint local_4;
  
  if (is_lap_enabled == 0) {
    local_19 = 0.995 <= gf_zero_motion && 0x62 < kf_zero_motion;
  }
  else {
    local_19 = 0.999 <= gf_zero_motion;
  }
  local_4 = (uint)local_19;
  return local_4;
}

Assistant:

static inline int is_almost_static(double gf_zero_motion, int kf_zero_motion,
                                   int is_lap_enabled) {
  if (is_lap_enabled) {
    /*
     * when LAP enabled kf_zero_motion is not reliable, so use strict
     * constraint on gf_zero_motion.
     */
    return (gf_zero_motion >= 0.999);
  } else {
    return (gf_zero_motion >= 0.995) &&
           (kf_zero_motion >= STATIC_KF_GROUP_THRESH);
  }
}